

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O1

cn_cbor * cn_cbor_index(cn_cbor *cb,uint idx)

{
  cn_cbor *pcVar1;
  int iVar2;
  
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0x3c,"cn_cbor *cn_cbor_index(const cn_cbor *, unsigned int)");
  }
  pcVar1 = cb->first_child;
  if (pcVar1 != (cn_cbor *)0x0) {
    iVar2 = idx + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return pcVar1;
      }
      pcVar1 = pcVar1->next;
    } while (pcVar1 != (cn_cbor *)0x0);
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_index(const cn_cbor* cb, unsigned int idx) {
  cn_cbor *cp;
  unsigned int i = 0;
  assert(cb);
  for (cp = cb->first_child; cp; cp = cp->next) {
    if (i == idx) {
      return cp;
    }
    i++;
  }
  return NULL;
}